

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::submit::render_value(submit *this,form_context *context)

{
  ostream *poVar1;
  escape local_60;
  streamable local_38;
  
  poVar1 = form_context::out(context);
  poVar1 = std::operator<<(poVar1,"value=\"");
  filters::streamable::streamable<booster::locale::basic_message<char>>
            (&local_38,(basic_message<char> *)&(this->super_base_html_input).field_0x40);
  filters::escape::escape(&local_60,&local_38);
  filters::escape::operator()(&local_60,poVar1);
  std::operator<<(poVar1,"\" ");
  filters::escape::~escape(&local_60);
  filters::streamable::~streamable(&local_38);
  return;
}

Assistant:

void submit::render_value(form_context &context)
{
	context.out() << "value=\"" << filters::escape(value_) << "\" ";
}